

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complextype.cpp
# Opt level: O0

ResultValue * __thiscall
ComplexType::toResultValue
          (ResultValue *__return_storage_ptr__,ComplexType *this,NumericConstant *numericConstant)

{
  ulong uVar1;
  char cVar2;
  bool bVar3;
  NumericChars *pNVar4;
  size_type sVar5;
  const_reference pvVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar7;
  char *pcVar8;
  double __i;
  double dVar9;
  Complex value;
  Complex value_00;
  Complex value_01;
  Complex value_02;
  complex<double> local_e0;
  complex<double> local_d0;
  complex<double> local_c0;
  undefined4 local_ac;
  complex<double> local_a8;
  NumericConstantChar local_91;
  ulong uStack_90;
  value_type c;
  size_t i;
  bool isComplex;
  string *psStack_80;
  bool atRealPart;
  string *currentPart;
  undefined1 local_70 [8];
  string imaginaryPart;
  allocator local_39;
  undefined1 local_38 [8];
  string realPart;
  NumericConstant *numericConstant_local;
  ComplexType *this_local;
  
  realPart.field_2._8_8_ = numericConstant;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_70,"",(allocator *)((long)&currentPart + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&currentPart + 7));
  psStack_80 = (string *)local_38;
  i._7_1_ = 1;
  i._6_1_ = 0;
  uStack_90 = 0;
  do {
    uVar1 = uStack_90;
    pNVar4 = NumericConstant::chars((NumericConstant *)realPart.field_2._8_8_);
    sVar5 = std::vector<NumericConstantChar,_std::allocator<NumericConstantChar>_>::size(pNVar4);
    if (sVar5 <= uVar1) {
      if ((i._6_1_ & 1) == 0) {
        uVar7 = 0;
        dVar9 = std::__cxx11::stod((string *)local_38,(size_t *)0x0);
        std::complex<double>::complex(&local_e0,dVar9,0.0);
        value_02._M_value._8_8_ = extraout_RDX_02;
        value_02._M_value._0_8_ = uVar7;
        ResultValue::ResultValue(__return_storage_ptr__,value_02);
      }
      else {
        bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,"");
        if (bVar3) {
          dVar9 = std::__cxx11::stod((string *)local_38,(size_t *)0x0);
          uVar7 = 0;
          __i = std::__cxx11::stod((string *)local_70,(size_t *)0x0);
          std::complex<double>::complex(&local_a8,dVar9,__i);
          value._M_value._8_8_ = extraout_RDX;
          value._M_value._0_8_ = uVar7;
          ResultValue::ResultValue(__return_storage_ptr__,value);
        }
        else {
          pcVar8 = "";
          bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_70,"");
          if (bVar3) {
            uVar7 = 0;
            dVar9 = std::__cxx11::stod((string *)local_70,(size_t *)0x0);
            std::complex<double>::complex(&local_c0,0.0,dVar9);
            value_00._M_value._8_8_ = extraout_RDX_00;
            value_00._M_value._0_8_ = uVar7;
            ResultValue::ResultValue(__return_storage_ptr__,value_00);
          }
          else {
            std::complex<double>::complex(&local_d0,0.0,1.0);
            value_01._M_value._8_8_ = extraout_RDX_01;
            value_01._M_value._0_8_ = pcVar8;
            ResultValue::ResultValue(__return_storage_ptr__,value_01);
          }
        }
      }
      local_ac = 1;
      std::__cxx11::string::~string((string *)local_70);
      std::__cxx11::string::~string((string *)local_38);
      return __return_storage_ptr__;
    }
    pNVar4 = NumericConstant::chars((NumericConstant *)realPart.field_2._8_8_);
    pvVar6 = std::vector<NumericConstantChar,_std::allocator<NumericConstantChar>_>::operator[]
                       (pNVar4,uStack_90);
    local_91 = *pvVar6;
    if (local_91 < A) {
LAB_001b26d1:
      cVar2 = NumericConstantChars::getChar(local_91);
      std::__cxx11::string::operator+=(psStack_80,cVar2);
    }
    else if ((byte)(local_91 - MinusSign) < 2) {
      if (uStack_90 == 0) {
        cVar2 = NumericConstantChars::getChar(local_91);
        std::__cxx11::string::operator+=(psStack_80,cVar2);
      }
      else {
        std::__cxx11::string::operator=(psStack_80,(string *)local_70);
        i._7_1_ = 0;
      }
    }
    else {
      if (local_91 == DecimalPoint) goto LAB_001b26d1;
      if (local_91 == ImaginaryUnit) {
        if ((i._7_1_ & 1) != 0) {
          std::__cxx11::string::operator=((string *)local_70,(string *)local_38);
          std::__cxx11::string::operator=((string *)local_38,"");
        }
        i._6_1_ = 1;
      }
    }
    uStack_90 = uStack_90 + 1;
  } while( true );
}

Assistant:

ResultValue ComplexType::toResultValue(const NumericConstant& numericConstant) const {
	std::string realPart = "";
	std::string imaginaryPart = "";
	std::string& currentPart = realPart;
	bool atRealPart = true;
	bool isComplex = false;

	for (std::size_t i = 0; i < numericConstant.chars().size(); i++) {
		auto c = numericConstant.chars()[i];

		switch (c) {
			case NumericConstantChar::Zero:
			case NumericConstantChar::One:
			case NumericConstantChar::Two:
			case NumericConstantChar::Three:
			case NumericConstantChar::Four:
			case NumericConstantChar::Five:
			case NumericConstantChar::Six:
			case NumericConstantChar::Seven:
			case NumericConstantChar::Eight:
			case NumericConstantChar::Nine:
			case NumericConstantChar::DecimalPoint:
				currentPart += NumericConstantChars::getChar(c);
				break;
			case NumericConstantChar::MinusSign:
			case NumericConstantChar::PlusSign:
				if (i > 0) {
					currentPart = imaginaryPart;
					atRealPart = false;
				} else {
					currentPart += NumericConstantChars::getChar(c);
				}
				break;
			case NumericConstantChar::ImaginaryUnit:
				if (atRealPart) {
					imaginaryPart = realPart;
					realPart = "";
				}

				isComplex = true;
				break;
			default:
				break;
		}
	}

	if (isComplex) {
		if (realPart != "") {
			return Complex(std::stod(realPart), std::stod(imaginaryPart));
		} else if (imaginaryPart != "") {
			return Complex(0.0, std::stod(imaginaryPart));
		} else {
			return Complex(0.0, 1.0);
		}
	} else {
		return Complex(std::stod(realPart), 0.0);
	}
}